

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvparams_tests.cpp
# Opt level: O0

void CsvParamsIntTest::TearDownTestCase(void)

{
  bool bVar1;
  char *message;
  Fixed *in_stack_fffffffffffffde8;
  AssertionHelper local_208;
  Fixed local_1c8;
  char local_3c [4];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  size_t i;
  
  iutest_ar.m_result = false;
  iutest_ar._33_7_ = 0;
  for (; (ulong)iutest_ar._32_8_ < 7; iutest_ar._32_8_ = iutest_ar._32_8_ + 1) {
    iutest::detail::AlwaysZero();
    local_3c[0] = '\0';
    local_3c[1] = '\0';
    local_3c[2] = '\0';
    local_3c[3] = '\0';
    iutest::internal::backward::EqHelper<true>::Compare<int,int>
              ((AssertionResult *)local_38,(EqHelper<true> *)0x172316,"check_params[i]",local_3c,
               check_params + iutest_ar._32_8_,(int *)&iutest_type_traits::enabler_t<void>::value,
               (type **)in_stack_fffffffffffffde8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
    if (!bVar1) {
      memset(&local_1c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
      in_stack_fffffffffffffde8 =
           iutest::AssertionHelper::Fixed::operator<<(&local_1c8,iutest_ar._32_8_);
      message = iutest::AssertionResult::message((AssertionResult *)local_38);
      iutest::AssertionHelper::AssertionHelper
                (&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/csvparams_tests.cpp"
                 ,0x2d,message,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_208,in_stack_fffffffffffffde8);
      iutest::AssertionHelper::~AssertionHelper(&local_208);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  }
  return;
}

Assistant:

static void TearDownTestCase(void)
    {
        for( size_t i=0; i < IUTEST_PP_COUNTOF(check_params); ++i )
        {
            IUTEST_EXPECT_EQ( 0, check_params[i] ) << i;
        }
    }